

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::IsoWriter(IsoWriter *this,IsoHeaderData *hdrData)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_volumeLabel)._M_dataplus._M_p = (pointer)&(this->m_volumeLabel).field_2;
  (this->m_volumeLabel)._M_string_length = 0;
  (this->m_volumeLabel).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->m_impId,(string *)&hdrData->impId);
  std::__cxx11::string::string((string *)&this->m_appId,(string *)hdrData);
  this->m_volumeId = hdrData->volumeId;
  File::File(&this->m_file);
  memset(this->m_buffer,0,0x800);
  this->m_currentTime = hdrData->fileTime;
  this->m_metadataLBN = 0;
  this->m_metadataMirrorLBN = 0;
  this->m_curMetadataPos = 0;
  (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header;
  this->m_metadataMappingFile = (FileEntryInfo *)0x0;
  this->m_partitionStartAddress = 0;
  this->m_partitionEndAddress = 0;
  (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_objectUniqId = '\x10';
  this->m_rootDirInfo = (FileEntryInfo *)0x0;
  this->m_systemStreamDir = (FileEntryInfo *)0x0;
  this->m_totalFiles = 0;
  this->m_totalDirectories = 0;
  *(undefined8 *)&this->m_volumeSize = 0;
  this->m_metadataFileLen = 0x30000;
  this->m_systemStreamLBN = 0;
  this->m_tagLocationBaseAddr = 0;
  this->m_lastWritedObjectID = -1;
  this->m_opened = false;
  std::__cxx11::string::assign((char *)this);
  this->m_layerBreakPoint = 0;
  return;
}

Assistant:

IsoWriter::IsoWriter(const IsoHeaderData &hdrData)
    : m_impId(hdrData.impId),
      m_appId(hdrData.appId),
      m_volumeId(hdrData.volumeId),
      m_buffer{},
      m_currentTime(hdrData.fileTime),
      m_metadataMappingFile(nullptr),
      m_partitionStartAddress(0),
      m_partitionEndAddress(0),
      m_metadataLBN(0),
      m_curMetadataPos(0)
{
    m_objectUniqId = 16;
    m_totalFiles = 0;
    m_totalDirectories = 0;
    m_volumeSize = 0;
    // m_sectorNum = 0;
    m_rootDirInfo = nullptr;
    m_systemStreamDir = nullptr;

    m_metadataFileLen = 0x30000;
    m_systemStreamLBN = 0;
    m_metadataMirrorLBN = 0;
    m_tagLocationBaseAddr = 0;
    m_lastWritedObjectID = -1;
    m_opened = false;
    m_volumeLabel = " ";
    m_layerBreakPoint = 0;
}